

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_hasLinkedUnitsWhenUnitsObjectAddedToBothModelAndVariable_Test::TestBody
          (Units_hasLinkedUnitsWhenUnitsObjectAddedToBothModelAndVariable_Test *this)

{
  byte bVar1;
  char cVar2;
  ModelPtr m;
  AssertionResult gtest_ar_;
  VariablePtr v1;
  UnitsPtr u1;
  ComponentPtr c1;
  long *local_90;
  AssertHelper local_88 [8];
  AssertionResult local_80;
  long local_70 [2];
  shared_ptr *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  byte local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  shared_ptr *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  shared_ptr *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Units::create();
  libcellml::Variable::create();
  local_80._0_8_ = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"a_unit","");
  libcellml::NamedEntity::setName(local_30);
  if ((long *)local_80._0_8_ != local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  libcellml::Variable::setUnits(local_40);
  libcellml::Component::addVariable(local_20);
  libcellml::ComponentEntity::addComponent(local_60);
  libcellml::Model::addUnits(local_60);
  bVar1 = libcellml::Model::hasUnlinkedUnits();
  local_50[0] = bVar1 ^ 1;
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(char *)local_50,"m->hasUnlinkedUnits()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x18a,(char *)local_80._0_8_);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    if ((long *)local_80._0_8_ != local_70) {
      operator_delete((void *)local_80._0_8_,local_70[0] + 1);
    }
    if (local_90 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_90 != (long *)0x0)) {
        (**(code **)(*local_90 + 8))();
      }
      local_90 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

TEST(Units, hasLinkedUnitsWhenUnitsObjectAddedToBothModelAndVariable)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();

    u1->setName("a_unit");

    v1->setUnits(u1);

    c1->addVariable(v1);
    m->addComponent(c1);
    m->addUnits(u1);

    EXPECT_FALSE(m->hasUnlinkedUnits());
}